

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_stbvorbis_read_pcm_frames
                    (ma_stbvorbis *pVorbis,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  ma_uint32 *pmVar1;
  uint uVar2;
  uint uVar3;
  ma_uint32 channels;
  float **ppfVar4;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var5;
  ma_result mVar6;
  int iVar7;
  ma_result mVar8;
  ma_uint8 *pmVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  size_t __n;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ma_uint64 framesRemaining;
  float *pFramesOutF32;
  ulong uVar17;
  ma_uint64 mVar18;
  size_t bytesRead;
  ma_uint32 local_54;
  float ***local_50;
  ma_uint64 local_48;
  void *local_40;
  size_t local_38;
  
  if (pFramesRead != (ma_uint64 *)0x0) {
    *pFramesRead = 0;
  }
  mVar6 = MA_INVALID_ARGS;
  if (pVorbis != (ma_stbvorbis *)0x0 && frameCount != 0) {
    if (pVorbis->format == ma_format_f32) {
      local_48 = frameCount;
      local_40 = pFramesOut;
      if (pVorbis->usingPushMode == 0) {
        channels = pVorbis->channels;
        mVar18 = 0;
        local_50 = (float ***)pFramesRead;
        do {
          uVar17 = local_48 - mVar18;
          if (local_48 < mVar18 || uVar17 == 0) {
            pVorbis->cursor = pVorbis->cursor + mVar18;
            mVar6 = MA_SUCCESS;
            pFramesRead = (ma_uint64 *)local_50;
            goto LAB_0014e595;
          }
          if (0x7ffffffe < uVar17) {
            uVar17 = 0x7fffffff;
          }
          iVar7 = stb_vorbis_get_samples_float_interleaved
                            (pVorbis->stb,channels,
                             (float *)(mVar18 * (channels * 4) + (long)local_40),
                             channels * (int)uVar17);
          mVar18 = mVar18 + (long)iVar7;
        } while ((int)uVar17 <= iVar7);
        mVar8 = MA_SUCCESS;
        pFramesRead = (ma_uint64 *)local_50;
      }
      else {
        local_50 = &(pVorbis->push).ppPacketData;
        uVar17 = 0;
        while( true ) {
          uVar2 = (pVorbis->push).framesRemaining;
          uVar10 = local_48 - uVar17 & 0xffffffff;
          if ((ulong)uVar2 < local_48 - uVar17) {
            uVar10 = (ulong)uVar2;
          }
          uVar14 = uVar10;
          if (local_40 != (void *)0x0) {
            if (uVar10 == 0) {
              uVar14 = 0;
            }
            else {
              uVar12 = (ulong)pVorbis->channels;
              uVar15 = 0;
              do {
                if (uVar12 != 0) {
                  ppfVar4 = (pVorbis->push).ppPacketData;
                  uVar3 = (pVorbis->push).framesConsumed;
                  uVar16 = 0;
                  do {
                    *(float *)((long)pFramesOut + uVar16 * 4) = ppfVar4[uVar16][uVar15 + uVar3];
                    uVar16 = uVar16 + 1;
                  } while (uVar12 != uVar16);
                }
                pFramesOut = (void *)((long)pFramesOut + uVar12 * 4);
                uVar15 = uVar15 + 1;
              } while (uVar15 != uVar10);
            }
          }
          pmVar1 = &(pVorbis->push).framesConsumed;
          *pmVar1 = *pmVar1 + (int)uVar10;
          (pVorbis->push).framesRemaining = uVar2 - (int)uVar10;
          uVar17 = uVar17 + uVar14;
          mVar8 = MA_SUCCESS;
          mVar18 = local_48;
          if (uVar17 == local_48) break;
          uVar10 = (pVorbis->push).dataSize;
          while (local_54 = 0, mVar18 = uVar17, uVar10 < 0x80000000) {
            iVar7 = stb_vorbis_decode_frame_pushdata
                              (pVorbis->stb,(pVorbis->push).pData,(int)uVar10,(int *)0x0,local_50,
                               (int *)&local_54);
            if (iVar7 != 0) {
              pmVar9 = (pVorbis->push).pData;
              __n = (pVorbis->push).dataSize - (long)iVar7;
              (pVorbis->push).dataSize = __n;
              memmove(pmVar9,pmVar9 + iVar7,__n);
              (pVorbis->push).framesConsumed = 0;
              (pVorbis->push).framesRemaining = local_54;
              break;
            }
            sVar11 = (pVorbis->push).dataSize;
            sVar13 = (pVorbis->push).dataCapacity;
            if (sVar13 == sVar11) {
              p_Var5 = (pVorbis->allocationCallbacks).onRealloc;
              mVar8 = MA_OUT_OF_MEMORY;
              if (p_Var5 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) goto LAB_0014e583;
              sVar13 = sVar13 + 0x1000;
              pmVar9 = (ma_uint8 *)
                       (*p_Var5)((pVorbis->push).pData,sVar13,
                                 (pVorbis->allocationCallbacks).pUserData);
              if (pmVar9 == (ma_uint8 *)0x0) goto LAB_0014e583;
              (pVorbis->push).pData = pmVar9;
              (pVorbis->push).dataCapacity = sVar13;
              sVar11 = (pVorbis->push).dataSize;
            }
            else {
              pmVar9 = (pVorbis->push).pData;
            }
            mVar8 = (*pVorbis->onRead)(pVorbis->pReadSeekTellUserData,pmVar9 + sVar11,
                                       sVar13 - sVar11,&local_38);
            uVar10 = (pVorbis->push).dataSize + local_38;
            (pVorbis->push).dataSize = uVar10;
            if (mVar8 != MA_SUCCESS) goto LAB_0014e583;
          }
          mVar8 = MA_SUCCESS;
          if (local_48 <= uVar17) break;
        }
      }
LAB_0014e583:
      pVorbis->cursor = pVorbis->cursor + mVar18;
      mVar6 = MA_AT_END;
      if (mVar18 != 0) {
        mVar6 = mVar8;
      }
    }
    else {
      mVar6 = MA_AT_END;
      mVar18 = 0;
    }
LAB_0014e595:
    if (pFramesRead != (ma_uint64 *)0x0) {
      *pFramesRead = mVar18;
    }
  }
  return mVar6;
}

Assistant:

MA_API ma_result ma_stbvorbis_read_pcm_frames(ma_stbvorbis* pVorbis, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (pVorbis == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_VORBIS)
    {
        /* We always use floating point format. */
        ma_result result = MA_SUCCESS;  /* Must be initialized to MA_SUCCESS. */
        ma_uint64 totalFramesRead = 0;
        ma_format format;
        ma_uint32 channels;

        ma_stbvorbis_get_data_format(pVorbis, &format, &channels, NULL, NULL, 0);

        if (format == ma_format_f32) {
            /* We read differently depending on whether or not we're using push mode. */
            if (pVorbis->usingPushMode) {
                /* Push mode. This is the complex case. */
                float* pFramesOutF32 = (float*)pFramesOut;

                while (totalFramesRead < frameCount) {
                    /* The first thing to do is read from any already-cached frames. */
                    ma_uint32 framesToReadFromCache = (ma_uint32)ma_min(pVorbis->push.framesRemaining, (frameCount - totalFramesRead));  /* Safe cast because pVorbis->framesRemaining is 32-bit. */

                    /* The output pointer can be null in which case we just treat it as a seek. */
                    if (pFramesOut != NULL) {
                        ma_uint64 iFrame;
                        for (iFrame = 0; iFrame < framesToReadFromCache; iFrame += 1) {
                            ma_uint32 iChannel;
                            for (iChannel = 0; iChannel < pVorbis->channels; iChannel += 1) {
                                pFramesOutF32[iChannel] = pVorbis->push.ppPacketData[iChannel][pVorbis->push.framesConsumed + iFrame];
                            }

                            pFramesOutF32 += pVorbis->channels;
                        }
                    }

                    /* Update pointers and counters. */
                    pVorbis->push.framesConsumed  += framesToReadFromCache;
                    pVorbis->push.framesRemaining -= framesToReadFromCache;
                    totalFramesRead               += framesToReadFromCache;

                    /* Don't bother reading any more frames right now if we've just finished loading. */
                    if (totalFramesRead == frameCount) {
                        break;
                    }

                    MA_ASSERT(pVorbis->push.framesRemaining == 0);

                    /* Getting here means we've run out of cached frames. We'll need to load some more. */
                    for (;;) {
                        int samplesRead = 0;
                        int consumedDataSize;

                        /* We need to case dataSize to an int, so make sure we can do it safely. */
                        if (pVorbis->push.dataSize > INT_MAX) {
                            break;  /* Too big. */
                        }

                        consumedDataSize = stb_vorbis_decode_frame_pushdata(pVorbis->stb, pVorbis->push.pData, (int)pVorbis->push.dataSize, NULL, &pVorbis->push.ppPacketData, &samplesRead);
                        if (consumedDataSize != 0) {
                            /* Successfully decoded a Vorbis frame. Consume the data. */
                            pVorbis->push.dataSize -= (size_t)consumedDataSize;
                            MA_MOVE_MEMORY(pVorbis->push.pData, ma_offset_ptr(pVorbis->push.pData, consumedDataSize), pVorbis->push.dataSize);

                            pVorbis->push.framesConsumed  = 0;
                            pVorbis->push.framesRemaining = samplesRead;

                            break;
                        } else {
                            /* Not enough data. Read more. */
                            size_t bytesRead;

                            /* Expand the data buffer if necessary. */
                            if (pVorbis->push.dataCapacity == pVorbis->push.dataSize) {
                                size_t newCap = pVorbis->push.dataCapacity + MA_VORBIS_DATA_CHUNK_SIZE;
                                ma_uint8* pNewData;

                                pNewData = (ma_uint8*)ma_realloc(pVorbis->push.pData, newCap, &pVorbis->allocationCallbacks);
                                if (pNewData == NULL) {
                                    result = MA_OUT_OF_MEMORY;
                                    break;
                                }

                                pVorbis->push.pData = pNewData;
                                pVorbis->push.dataCapacity = newCap;
                            }

                            /* We should have enough room to load some data. */
                            result = pVorbis->onRead(pVorbis->pReadSeekTellUserData, ma_offset_ptr(pVorbis->push.pData, pVorbis->push.dataSize), (pVorbis->push.dataCapacity - pVorbis->push.dataSize), &bytesRead);
                            pVorbis->push.dataSize += bytesRead;

                            if (result != MA_SUCCESS) {
                                break;  /* Failed to read any data. Get out. */
                            }
                        }
                    }

                    /* If we don't have a success code at this point it means we've encountered an error or the end of the file has been reached (probably the latter). */
                    if (result != MA_SUCCESS) {
                        break;
                    }
                }
            } else {
                /* Pull mode. This is the simple case, but we still need to run in a loop because stb_vorbis loves using 32-bit instead of 64-bit. */
                while (totalFramesRead < frameCount) {
                    ma_uint64 framesRemaining = (frameCount - totalFramesRead);
                    int framesRead;

                    if (framesRemaining > INT_MAX) {
                        framesRemaining = INT_MAX;
                    }

                    framesRead = stb_vorbis_get_samples_float_interleaved(pVorbis->stb, channels, (float*)ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, format, channels), (int)framesRemaining * channels);   /* Safe cast. */
                    totalFramesRead += framesRead;

                    if (framesRead < (int)framesRemaining) {
                        break;  /* Nothing left to read. Get out. */
                    }
                }
            }
        } else {
            result = MA_INVALID_ARGS;
        }

        pVorbis->cursor += totalFramesRead;

        if (totalFramesRead == 0) {
            result = MA_AT_END;
        }

        if (pFramesRead != NULL) {
            *pFramesRead = totalFramesRead;
        }

        if (result == MA_SUCCESS && totalFramesRead == 0) {
            result  = MA_AT_END;
        }

        return result;
    }
    #else
    {
        /* vorbis is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);

        (void)pFramesOut;
        (void)frameCount;
        (void)pFramesRead;

        return MA_NOT_IMPLEMENTED;
    }
    #endif
}